

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::calcFunctional(EAM *this,SelfData *sdat)

{
  double dVar1;
  reference pvVar2;
  double *pdVar3;
  int *in_RSI;
  long in_RDI;
  EAMAtomData *data1;
  RealType *in_stack_00000048;
  RealType *in_stack_00000050;
  RealType *in_stack_00000058;
  CubicSpline *in_stack_00000060;
  EAM *in_stack_00000320;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000320);
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)*in_RSI);
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::operator[]
            ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)(in_RDI + 0x58),
             (long)*pvVar2);
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x36d26a);
  CubicSpline::getValueAndDerivativeAt
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  dVar1 = *(double *)(in_RSI + 0x18);
  pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 4),3);
  *pdVar3 = dVar1 + *pdVar3;
  if ((*(byte *)(in_RSI + 0x20) & 1) != 0) {
    dVar1 = *(double *)(in_RSI + 0x18);
    pdVar3 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x22),3);
    *pdVar3 = dVar1 + *pdVar3;
  }
  if ((*(byte *)(in_RSI + 0x12) & 1) != 0) {
    *(double *)(in_RSI + 0x14) = *(double *)(in_RSI + 0x18) + *(double *)(in_RSI + 0x14);
  }
  return;
}

Assistant:

void EAM::calcFunctional(SelfData& sdat) {
    if (!initialized_) initialize();
    EAMAtomData& data1 = EAMdata[EAMtids[sdat.atid]];

    data1.F->getValueAndDerivativeAt(sdat.rho, sdat.frho, sdat.dfrhodrho);

    sdat.selfPot[METALLIC_EMBEDDING_FAMILY] += sdat.frho;

    if (sdat.isSelected) sdat.selePot[METALLIC_EMBEDDING_FAMILY] += sdat.frho;

    if (sdat.doParticlePot) sdat.particlePot += sdat.frho;

    return;
  }